

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_java_struct_result_writer
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *tfield;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  t_javame_generator *this_00;
  pointer pptVar5;
  string name;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_b0);
  poVar4 = std::operator<<(poVar4,"public void write(TProtocol oprot) throws TException {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&local_b0,(string *)CONCAT44(extraout_var,iVar3));
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"oprot.writeStructBegin(STRUCT_DESC);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  bVar2 = true;
  for (pptVar5 = (tstruct->members_in_id_order_).
                 super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    if (bVar2) {
      poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_d0);
      std::operator<<(poVar4,"if ");
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      std::operator<<(out," else if ");
    }
    poVar4 = std::operator<<(out,"(this.");
    generate_isset_check_abi_cxx11_(&local_d0,this,*pptVar5);
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    poVar4 = std::operator<<(poVar4,") {");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"oprot.writeFieldBegin(");
    this_00 = (t_javame_generator *)&(*pptVar5)->name_;
    std::__cxx11::string::string((string *)&local_70,(string *)this_00);
    constant_name(&local_d0,this_00,&local_70);
    poVar4 = std::operator<<(poVar4,(string *)&local_d0);
    poVar4 = std::operator<<(poVar4,"_FIELD_DESC);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    tfield = *pptVar5;
    std::__cxx11::string::string((string *)&local_50,"this.",(allocator *)&local_d0);
    generate_serialize_field(this,out,tfield,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    poVar4 = t_generator::indent((t_generator *)this,out);
    poVar4 = std::operator<<(poVar4,"oprot.writeFieldEnd();");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar4 = t_generator::indent((t_generator *)this,out);
    std::operator<<(poVar4,"}");
    bVar2 = false;
  }
  poVar4 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_d0);
  poVar4 = std::operator<<(poVar4,"oprot.writeFieldStop();");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,(t_generator *)this);
  poVar4 = std::operator<<(poVar4,(string *)&local_90);
  poVar4 = std::operator<<(poVar4,"oprot.writeStructEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_d0);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
  poVar4 = std::operator<<(out,(string *)&local_d0);
  poVar4 = std::operator<<(poVar4,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_result_writer(ostream& out, t_struct* tstruct) {
  out << indent() << "public void write(TProtocol oprot) throws TException {" << endl;
  indent_up();

  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "oprot.writeStructBegin(STRUCT_DESC);" << endl;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << endl << indent() << "if ";
    } else {
      out << " else if ";
    }

    out << "(this." << generate_isset_check(*f_iter) << ") {" << endl;

    indent_up();

    indent(out) << "oprot.writeFieldBegin(" << constant_name((*f_iter)->get_name())
                << "_FIELD_DESC);" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    // Write field closer
    indent(out) << "oprot.writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}";
  }
  // Write the struct map
  out << endl << indent() << "oprot.writeFieldStop();" << endl << indent()
      << "oprot.writeStructEnd();" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;
}